

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fossilize_disasm.cpp
# Opt level: O0

bool __thiscall
FilterReplayer::enqueue_create_raytracing_pipeline
          (FilterReplayer *this,Hash hash,VkRayTracingPipelineCreateInfoKHR *create_info,
          VkPipeline *pipeline)

{
  VkPipeline_T *pVVar1;
  size_type sVar2;
  bool bVar3;
  pair<std::__detail::_Node_iterator<unsigned_long,_true,_false>,_bool> pVar4;
  value_type local_98;
  uint local_8c;
  _Node_iterator_base<unsigned_long,_false> _Stack_88;
  uint32_t i_3;
  undefined1 local_80;
  value_type local_78;
  uint local_6c;
  _Node_iterator_base<unsigned_long,_false> _Stack_68;
  uint32_t i_2;
  undefined1 local_60;
  VkPipeline local_58;
  key_type local_50;
  uint local_44;
  key_type kStack_40;
  uint32_t i_1;
  uint local_38;
  bool local_31;
  uint32_t i;
  bool active;
  VkPipeline *pipeline_local;
  VkRayTracingPipelineCreateInfoKHR *create_info_local;
  Hash hash_local;
  FilterReplayer *this_local;
  
  _i = pipeline;
  pipeline_local = (VkPipeline *)create_info;
  create_info_local = (VkRayTracingPipelineCreateInfoKHR *)hash;
  hash_local = (Hash)this;
  pVVar1 = fake_handle<VkPipeline_T*>(hash);
  *_i = pVVar1;
  sVar2 = std::
          unordered_set<unsigned_long,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<unsigned_long>_>
          ::count(&this->filter_raytracing,(key_type *)&create_info_local);
  if (sVar2 == 0) {
    local_31 = false;
    local_38 = 0;
    while( true ) {
      bVar3 = false;
      if (local_31 == false) {
        bVar3 = local_38 < *(uint *)((long)pipeline_local + 0x14);
      }
      if (!bVar3) break;
      kStack_40 = *(key_type *)(pipeline_local[3] + (ulong)local_38 * 0x30 + 0x18);
      sVar2 = std::
              unordered_set<unsigned_long,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<unsigned_long>_>
              ::count(&this->filter_modules,&stack0xffffffffffffffc0);
      local_31 = sVar2 != 0;
      local_38 = local_38 + 1;
    }
    local_44 = 0;
    while( true ) {
      bVar3 = false;
      if ((local_31 == false) && (bVar3 = false, pipeline_local[7] != (VkPipeline)0x0)) {
        bVar3 = local_44 < *(uint *)(pipeline_local[7] + 0x10);
      }
      if (!bVar3) break;
      local_50 = *(key_type *)(*(long *)(pipeline_local[7] + 0x18) + (ulong)local_44 * 8);
      sVar2 = std::
              unordered_set<unsigned_long,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<unsigned_long>_>
              ::count(&this->filter_raytracing,&local_50);
      local_31 = sVar2 != 0;
      local_44 = local_44 + 1;
    }
  }
  else {
    local_31 = true;
  }
  if (local_31 != false) {
    if (pipeline_local[0xb] != (VkPipeline)0x0) {
      local_58 = pipeline_local[0xb];
      pVar4 = std::
              unordered_set<unsigned_long,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<unsigned_long>_>
              ::insert(&this->filter_raytracing,(value_type *)&local_58);
      _Stack_68._M_cur =
           (__node_type *)pVar4.first.super__Node_iterator_base<unsigned_long,_false>._M_cur;
      local_60 = pVar4.second;
    }
    for (local_6c = 0; local_6c < *(uint *)((long)pipeline_local + 0x14); local_6c = local_6c + 1) {
      local_78 = *(value_type *)(pipeline_local[3] + (ulong)local_6c * 0x30 + 0x18);
      pVar4 = std::
              unordered_set<unsigned_long,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<unsigned_long>_>
              ::insert(&this->filter_modules_promoted,&local_78);
      _Stack_88._M_cur =
           (__node_type *)pVar4.first.super__Node_iterator_base<unsigned_long,_false>._M_cur;
      local_80 = pVar4.second;
    }
    if (pipeline_local[7] != (VkPipeline)0x0) {
      for (local_8c = 0; local_8c < *(uint *)(pipeline_local[7] + 0x10); local_8c = local_8c + 1) {
        local_98 = *(value_type *)(*(long *)(pipeline_local[7] + 0x18) + (ulong)local_8c * 8);
        std::
        unordered_set<unsigned_long,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<unsigned_long>_>
        ::insert(&this->filter_raytracing,&local_98);
      }
    }
    std::
    unordered_set<unsigned_long,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<unsigned_long>_>
    ::insert(&this->filter_raytracing,(value_type *)&create_info_local);
  }
  return true;
}

Assistant:

bool enqueue_create_raytracing_pipeline(Hash hash, const VkRayTracingPipelineCreateInfoKHR *create_info, VkPipeline *pipeline) override
	{
		*pipeline = fake_handle<VkPipeline>(hash);

		// We are active if we either explicitly add the pipeline, or we explicitly add one of the module dependencies.
		bool active;
		if (filter_raytracing.count(hash) != 0)
		{
			active = true;
		}
		else
		{
			active = false;
			for (uint32_t i = 0; !active && i < create_info->stageCount; i++)
				active = filter_modules.count((Hash)create_info->pStages[i].module) != 0;
			for (uint32_t i = 0; !active && create_info->pLibraryInfo && i < create_info->pLibraryInfo->libraryCount; i++)
				active = filter_raytracing.count((Hash)create_info->pLibraryInfo->pLibraries[i]) != 0;
		}

		if (!active)
			return true;

		// If the pipeline is to be emitted, promote all dependencies to be active as well.
		if (create_info->basePipelineHandle != VK_NULL_HANDLE)
			filter_raytracing.insert((Hash)create_info->basePipelineHandle);
		for (uint32_t i = 0; i < create_info->stageCount; i++)
			filter_modules_promoted.insert((Hash)create_info->pStages[i].module);
		if (create_info->pLibraryInfo)
			for (uint32_t i = 0; i < create_info->pLibraryInfo->libraryCount; i++)
				filter_raytracing.insert((Hash)create_info->pLibraryInfo->pLibraries[i]);
		filter_raytracing.insert(hash);

		return true;
	}